

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRUndef * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::allocate<unsigned_int&>
          (ObjectPool<diligent_spirv_cross::SPIRUndef> *this,uint *p)

{
  Vector<diligent_spirv_cross::SPIRUndef_*> *this_00;
  uint uVar1;
  _Tuple_impl<0UL,_diligent_spirv_cross::SPIRUndef_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>
  _Var2;
  size_t sVar3;
  ulong count;
  _Head_base<0UL,_diligent_spirv_cross::SPIRUndef_*,_false> _Var4;
  SPIRUndef *pSVar5;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRUndef_*>.buffer_size;
  if (sVar3 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRUndef,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRUndef_*,_false>._M_head_impl =
         (_Head_base<0UL,_diligent_spirv_cross::SPIRUndef_*,_false>)malloc(count << 4);
    if (_Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRUndef_*,_false>._M_head_impl ==
        (SPIRUndef *)0x0) {
      return (SPIRUndef *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRUndef_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRUndef_*>.buffer_size;
      _Var4._M_head_impl =
           (SPIRUndef *)
           _Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRUndef_*,_false>._M_head_impl;
      do {
        SmallVector<diligent_spirv_cross::SPIRUndef_*,_0UL>::reserve(this_00,sVar3 + 1);
        sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRUndef_*>.buffer_size;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRUndef_*>.ptr[sVar3] =
             _Var4._M_head_impl;
        sVar3 = sVar3 + 1;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRUndef_*>.buffer_size = sVar3;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRUndef,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRUndef,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>_>
              .buffer_size + 1);
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRUndef,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRUndef,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>_>
    .ptr[sVar3]._M_t.
    super___uniq_ptr_impl<diligent_spirv_cross::SPIRUndef,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRUndef_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>
    .super__Head_base<0UL,_diligent_spirv_cross::SPIRUndef_*,_false> =
         _Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRUndef_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRUndef,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>_>
    .buffer_size = sVar3 + 1;
    sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRUndef_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRUndef_*>.ptr[sVar3 - 1];
    if (sVar3 == 0) goto LAB_007ba67e;
  }
  else {
    pSVar5 = (this_00->super_VectorView<diligent_spirv_cross::SPIRUndef_*>).ptr[sVar3 - 1];
  }
  SmallVector<diligent_spirv_cross::SPIRUndef_*,_0UL>::resize(this_00,sVar3 - 1);
LAB_007ba67e:
  uVar1 = *p;
  (pSVar5->super_IVariant).self.id = 0;
  (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_00b5e4e0;
  *(uint *)&(pSVar5->super_IVariant).field_0xc = uVar1;
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}